

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O1

void __thiscall unitOps_flags_Test::TestBody(unitOps_flags_Test *this)

{
  return;
}

Assistant:

TEST(unitOps, flags)
{
    auto e1 = error;
    EXPECT_TRUE(e1.has_i_flag());
    EXPECT_TRUE(e1.has_e_flag());
    static_assert(
        error.has_i_flag(),
        "i flag should be constexpr and allowable in compile time constants");
    static_assert(
        error.has_e_flag(),
        "e flag should be constexpr and allowable in compile time constants");

    e1.clear_flags();
    EXPECT_FALSE(e1.has_i_flag());
    EXPECT_FALSE(e1.has_e_flag());
}